

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

uint32_t __thiscall B000FFReadWriter::calcbytesum(B000FFReadWriter *this,size_t size)

{
  element_type *peVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  long lVar5;
  uint32_t uVar6;
  ByteVector buf;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long lVar4;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_30,(ulong)this->_blocksize,&local_31);
  uVar6 = 0;
  do {
    if (size == 0) break;
    uVar3 = (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (size < (ulong)((long)local_30.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_30.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
      uVar3 = size;
    }
    peVar1 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (*peVar1->_vptr_ReadWriter[2])
                      (peVar1,local_30.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,uVar3 & 0xffffffff);
    lVar4 = CONCAT44(extraout_var,iVar2);
    if (lVar4 != 0) {
      lVar5 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + (uint)local_30.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
      uVar6 = uVar6 + iVar2;
      size = size - lVar4;
    }
  } while (lVar4 != 0);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar6;
}

Assistant:

uint32_t calcbytesum(size_t size)
    {
        uint32_t sum= 0;
        ByteVector buf(_blocksize);
        while (size)
        {
            uint32_t want= std::min(buf.size(), size);
            size_t nr= _r->read(&buf[0], want);
            if (nr==0)
                break;
            
            sum += calcbuffersum(&buf[0], nr);
            size -= nr;
        }

        return sum;
    }